

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-opt64.c
# Opt level: O1

void KeccakP1600_ExtractAndAddBytes(void *state,uchar *input,uchar *output,uint offset,uint length)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  undefined8 local_8;
  
  if (offset == 0) {
    if (7 < length) {
      uVar2 = 0;
      do {
        *(ulong *)(output + uVar2 * 8) =
             *(ulong *)((long)state + uVar2 * 8) ^ *(ulong *)(input + uVar2 * 8);
        uVar2 = uVar2 + 1;
      } while (length >> 3 != uVar2);
    }
    local_8 = *(undefined8 *)((long)state + (ulong)(length >> 3) * 8);
    if ((length & 7) != 0) {
      uVar2 = 0;
      do {
        output[uVar2 + (length & 0xfffffff8)] =
             *(byte *)((long)&local_8 + uVar2) ^ input[uVar2 + (length & 0xfffffff8)];
        uVar2 = uVar2 + 1;
      } while ((length & 7) != uVar2);
    }
  }
  else if (length != 0) {
    uVar4 = offset & 7;
    uVar3 = offset >> 3;
    do {
      uVar1 = 8 - uVar4;
      if (length <= 8 - uVar4) {
        uVar1 = length;
      }
      uVar2 = (ulong)uVar1;
      local_8 = *(undefined8 *)((long)state + (ulong)uVar3 * 8);
      uVar5 = 0;
      do {
        output[uVar5] = *(byte *)((long)&local_8 + (ulong)(uVar4 + (int)uVar5)) ^ input[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
      uVar3 = uVar3 + 1;
      input = input + uVar2;
      output = output + uVar2;
      uVar4 = 0;
      length = length - uVar1;
    } while (length != 0);
  }
  return;
}

Assistant:

void KeccakP1600_ExtractAndAddBytes(const void *state, const unsigned char *input, unsigned char *output, unsigned int offset, unsigned int length)
{
    SnP_ExtractAndAddBytes(state, input, output, offset, length, KeccakP1600_ExtractAndAddLanes, KeccakP1600_ExtractAndAddBytesInLane, 8);
}